

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

void __thiscall cashew::JSPrinter::printBlock(JSPrinter *this,Ref node)

{
  Value *pVVar1;
  size_t sVar2;
  Ref *pRVar3;
  JSPrinter *this_local;
  Ref node_local;
  
  this_local = (JSPrinter *)node.inst;
  pVVar1 = Ref::operator->((Ref *)&this_local);
  sVar2 = cashew::Value::size(pVVar1);
  if (sVar2 != 1) {
    pRVar3 = Ref::operator[]((Ref *)&this_local,1);
    pVVar1 = Ref::operator->(pRVar3);
    sVar2 = cashew::Value::size(pVVar1);
    if (sVar2 != 0) {
      emit(this,'{');
      this->indent = this->indent + 1;
      newline(this);
      pRVar3 = Ref::operator[]((Ref *)&this_local,1);
      printStats(this,pRVar3->inst);
      this->indent = this->indent + -1;
      newline(this);
      emit(this,'}');
      return;
    }
  }
  emit(this,"{}");
  return;
}

Assistant:

void printBlock(Ref node) {
    if (node->size() == 1 || node[1]->size() == 0) {
      emit("{}");
      return;
    }
    emit('{');
    indent++;
    newline();
    printStats(node[1]);
    indent--;
    newline();
    emit('}');
  }